

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileData.h
# Opt level: O0

void __thiscall Assimp::ObjFile::Object::~Object(Object *this)

{
  Object *this_00;
  bool bVar1;
  reference ppOVar2;
  __normal_iterator<Assimp::ObjFile::Object_**,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
  local_20;
  __normal_iterator<Assimp::ObjFile::Object_**,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
  local_18;
  iterator it;
  Object *this_local;
  
  it._M_current = (Object **)this;
  local_18._M_current =
       (Object **)
       std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::begin
                 (&this->m_SubObjects);
  while( true ) {
    local_20._M_current =
         (Object **)
         std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::end
                   (&this->m_SubObjects);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppOVar2 = __gnu_cxx::
              __normal_iterator<Assimp::ObjFile::Object_**,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppOVar2;
    if (this_00 != (Object *)0x0) {
      ~Object(this_00);
      operator_delete(this_00);
    }
    __gnu_cxx::
    __normal_iterator<Assimp::ObjFile::Object_**,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_Meshes);
  std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::~vector
            (&this->m_SubObjects);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Object() {
        for ( std::vector<Object*>::iterator it = m_SubObjects.begin(); it != m_SubObjects.end(); ++it) {
            delete *it;
        }
    }